

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

void * gotcha_realloc(void *buffer,size_t size)

{
  void *dest;
  
  dest = buffer;
  if (*(ulong *)((long)buffer + -8) < size) {
    dest = gotcha_malloc(size);
    if (dest == (void *)0x0) {
      dest = (void *)0x0;
    }
    else {
      gotcha_memcpy(dest,buffer,*(size_t *)((long)buffer + -8));
      *(malloc_link_t **)buffer = free_list;
      free_list = (malloc_link_t *)((long)buffer + -8);
    }
  }
  return dest;
}

Assistant:

void *gotcha_realloc(void* buffer, size_t size) 
{
   void *newbuffer;
   malloc_link_t *alloc;

   alloc = (malloc_link_t *) (((malloc_header_t *) buffer) - 1);

   if (size <= alloc->header.size)
      return buffer;

   newbuffer = gotcha_malloc(size);
   if (!newbuffer)
      return NULL;
   gotcha_memcpy(newbuffer, buffer, alloc->header.size);

   gotcha_free(buffer);

   return newbuffer;
}